

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_anomalous_ops.cc
# Opt level: O1

void filemgr_ops_anomalous_init(anomalous_callbacks *cbs,void *ctx)

{
  filemgr_anomalous_behavior = 0;
  normal_filemgr_ops = get_linux_filemgr_ops();
  filemgr_anomalous_behavior = 1;
  if (cbs == (anomalous_callbacks *)0x0) {
    ctx = (void *)0x0;
    cbs = &default_callbacks;
  }
  anon_cbs = cbs;
  anon_ctx = ctx;
  return;
}

Assistant:

void filemgr_ops_anomalous_init(struct anomalous_callbacks *cbs, void *ctx) {
    filemgr_ops_set_anomalous(0);
    normal_filemgr_ops = get_filemgr_ops();
    filemgr_ops_set_anomalous(1);
    if (!cbs) {
        anon_cbs = &default_callbacks;
        anon_ctx = (void *)NULL;
    } else {
        anon_cbs = cbs;
        anon_ctx = ctx;
    }
}